

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O0

void __thiscall google::protobuf::UnknownFieldSet::ClearFallback(UnknownFieldSet *this)

{
  bool bVar1;
  LogMessage *other;
  size_type sVar2;
  reference this_00;
  int local_64;
  LogFinisher local_5d;
  int n;
  byte local_49;
  LogMessage local_48;
  UnknownFieldSet *local_10;
  UnknownFieldSet *this_local;
  
  local_10 = this;
  bVar1 = std::
          vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>::
          empty(&this->fields_);
  local_49 = 0;
  if (bVar1) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/unknown_field_set.cc"
               ,0x3d);
    local_49 = 1;
    other = internal::LogMessage::operator<<(&local_48,"CHECK failed: !fields_.empty(): ");
    internal::LogFinisher::operator=(&local_5d,other);
  }
  if ((local_49 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_48);
  }
  sVar2 = std::
          vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>::
          size(&this->fields_);
  local_64 = (int)sVar2;
  do {
    local_64 = local_64 + -1;
    this_00 = std::
              vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
              ::operator[](&this->fields_,(long)local_64);
    UnknownField::Delete(this_00);
  } while (0 < local_64);
  std::vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>::
  clear(&this->fields_);
  return;
}

Assistant:

void UnknownFieldSet::ClearFallback() {
  GOOGLE_DCHECK(!fields_.empty());
  int n = fields_.size();
  do {
    (fields_)[--n].Delete();
  } while (n > 0);
  fields_.clear();
}